

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O2

FT_Error ps_mask_table_alloc(PS_Mask_Table table,FT_Memory memory,PS_Mask *amask)

{
  uint uVar1;
  ulong in_RAX;
  PS_Mask pPVar2;
  uint uVar3;
  undefined8 uStack_38;
  
  uVar1 = table->num_masks + 1;
  if (table->max_masks < uVar1) {
    uStack_38 = in_RAX & 0xffffffff;
    uVar3 = (table->num_masks & 0xfffffff8) + 8;
    pPVar2 = (PS_Mask)ft_mem_realloc(memory,0x18,(ulong)table->max_masks,(ulong)uVar3,table->masks,
                                     (FT_Error *)((long)&uStack_38 + 4));
    table->masks = pPVar2;
    if (uStack_38._4_4_ != 0) {
      pPVar2 = (PS_Mask)0x0;
      goto LAB_001fcbc0;
    }
    table->max_masks = uVar3;
  }
  else {
    pPVar2 = table->masks;
    uStack_38 = in_RAX;
  }
  pPVar2[(ulong)uVar1 - 1].num_bits = 0;
  pPVar2[(ulong)uVar1 - 1].end_point = 0;
  if (pPVar2[(ulong)uVar1 - 1].max_bits != 0) {
    memset(pPVar2[(ulong)uVar1 - 1].bytes,0,(ulong)(pPVar2[(ulong)uVar1 - 1].max_bits >> 3));
  }
  pPVar2 = pPVar2 + ((ulong)uVar1 - 1);
  table->num_masks = uVar1;
  uStack_38._4_4_ = 0;
LAB_001fcbc0:
  *amask = pPVar2;
  return uStack_38._4_4_;
}

Assistant:

static FT_Error
  ps_mask_table_alloc( PS_Mask_Table  table,
                       FT_Memory      memory,
                       PS_Mask       *amask )
  {
    FT_UInt   count;
    FT_Error  error = FT_Err_Ok;
    PS_Mask   mask  = NULL;


    count = table->num_masks;
    count++;

    if ( count > table->max_masks )
    {
      error = ps_mask_table_ensure( table, count, memory );
      if ( error )
        goto Exit;
    }

    mask             = table->masks + count - 1;
    mask->num_bits   = 0;
    mask->end_point  = 0;
    /* reused mask must be cleared */
    if ( mask->max_bits )
      FT_MEM_ZERO( mask->bytes, mask->max_bits >> 3 );

    table->num_masks = count;

  Exit:
    *amask = mask;
    return error;
  }